

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(monotonic_buffer_resource *this)

{
  (this->super_memory_resource)._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_02d19f90;
  release(this);
  std::__cxx11::
  _List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ::_M_clear(&(this->usedBlocks).
              super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
            );
  memory_resource::~memory_resource(&this->super_memory_resource);
  return;
}

Assistant:

~monotonic_buffer_resource() { release(); }